

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtSphereShape.h
# Opt level: O2

void * __thiscall cbtSphereShape::operator_new(size_t sizeInBytes)

{
  void *pvVar1;
  
  pvVar1 = cbtAlignedAllocInternal(sizeInBytes,0x10);
  return pvVar1;
}

Assistant:

cbtSphereShape(cbtScalar radius) : cbtConvexInternalShape()
	{
		m_shapeType = SPHERE_SHAPE_PROXYTYPE;
		m_localScaling.setValue(1.0, 1.0, 1.0);
		m_implicitShapeDimensions.setZero();
		m_implicitShapeDimensions.setX(radius);
		m_collisionMargin = radius;
		m_padding = 0;
	}